

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

void replace_backslash_doublequote_dollar(char *s)

{
  char cVar1;
  bool bVar2;
  char cVar3;
  char *a;
  char *pcVar4;
  
  cVar3 = *s;
  for (pcVar4 = s + 1; (cVar3 != '\0' && (cVar1 = *pcVar4, cVar1 != '\0')); pcVar4 = pcVar4 + 1) {
    bVar2 = cVar3 == '\\';
    cVar3 = cVar1;
    if (cVar1 == '\"' && bVar2) {
      *pcVar4 = '$';
      cVar3 = '$';
    }
  }
  return;
}

Assistant:

static void replace_backslash_doublequote_dollar(char* s)
{
    char* a = s;
    char* b = s+1;
    while (*a && *b)
    {
        if (*a == '\\' && *b == '\"')
        {
            *b = '$';
        }

        a++;
        b++;
    }
}